

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall dgMeshEffect::BoxMapping(dgMeshEffect *this,HaI32 front,HaI32 side,HaI32 top)

{
  undefined1 auVar1 [16];
  int iVar2;
  dgEdge *pdVar3;
  dgBigVector *pdVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  dgRedBackNode *pdVar9;
  HaI32 HVar10;
  dgVertexAtribute *pdVar11;
  double *pdVar12;
  HaI32 i;
  int iVar13;
  HaI32 i_00;
  dgEdge *pdVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  HaI32 materialArray [3];
  dgStack<dgMeshEffect::dgVertexAtribute> attribArray;
  Iterator local_168;
  dgBigVector p;
  dgBigVector e1;
  dgBigVector e0;
  dgTemplateVector<double> local_f8;
  dgBigVector scale;
  dgBigVector minVal;
  dgBigVector maxVal;
  dgBigVector n;
  dgBigVector dist;
  
  GetMinMax(&minVal,&maxVal,(HaF64 *)this->m_points,*(HaI32 *)&(this->super_dgRefCounter).field_0xc,
            0x20);
  scale.super_dgTemplateVector<double>._0_16_ =
       vsubpd_avx((undefined1  [16])maxVal.super_dgTemplateVector<double>._0_16_,
                  (undefined1  [16])minVal.super_dgTemplateVector<double>._0_16_);
  scale.super_dgTemplateVector<double>.m_z =
       maxVal.super_dgTemplateVector<double>.m_z - minVal.super_dgTemplateVector<double>.m_z;
  scale.super_dgTemplateVector<double>.m_w = maxVal.super_dgTemplateVector<double>.m_w;
  dgBigVector::dgBigVector(&dist,&scale.super_dgTemplateVector<double>);
  dgBigVector::dgBigVector
            (&scale,(HaF64)(1.0 / dist.super_dgTemplateVector<double>.m_x),
             (HaF64)(1.0 / dist.super_dgTemplateVector<double>.m_y),
             (HaF64)(1.0 / dist.super_dgTemplateVector<double>.m_z),0.0);
  dgStack<dgMeshEffect::dgVertexAtribute>::dgStack
            (&attribArray,(this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count);
  pdVar11 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[](&attribArray,0);
  EnumerateAttributeArray(this,pdVar11);
  materialArray[0] = front;
  materialArray[1] = side;
  materialArray[2] = top;
  HVar10 = dgPolyhedra::IncLRU(&this->super_dgPolyhedra);
  local_168.m_tree = (dgTree<dgEdge,_long> *)this;
  local_168.m_ptr =
       &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode;
  while (pdVar9 = local_168.m_ptr, (dgTreeNode *)local_168.m_ptr != (dgTreeNode *)0x0) {
    if (((dgEdge *)((long)local_168.m_ptr + 0x28))->m_mark < HVar10) {
      pdVar14 = ((dgEdge *)((long)local_168.m_ptr + 0x28))->m_next;
      pdVar3 = ((dgEdge *)((long)local_168.m_ptr + 0x28))->m_prev;
      iVar15 = ((dgEdge *)((long)local_168.m_ptr + 0x28))->m_incidentVertex;
      pdVar4 = this->m_points;
      iVar13 = pdVar14->m_incidentVertex;
      iVar2 = pdVar3->m_incidentVertex;
      ((dgEdge *)((long)local_168.m_ptr + 0x28))->m_mark = HVar10;
      pdVar14->m_mark = HVar10;
      pdVar3->m_mark = HVar10;
      dgTemplateVector<double>::operator-
                (&pdVar4[iVar13].super_dgTemplateVector<double>,
                 &pdVar4[iVar15].super_dgTemplateVector<double>);
      dgBigVector::dgBigVector(&e0,&e1.super_dgTemplateVector<double>);
      dgTemplateVector<double>::operator-
                (&pdVar4[iVar2].super_dgTemplateVector<double>,
                 &pdVar4[iVar15].super_dgTemplateVector<double>);
      dgBigVector::dgBigVector
                ((dgBigVector *)&e1.super_dgTemplateVector<double>,&n.super_dgTemplateVector<double>
                );
      auVar19._8_8_ = 0;
      auVar19._0_8_ = e0.super_dgTemplateVector<double>.m_x;
      auVar21._8_8_ = e0.super_dgTemplateVector<double>.m_z;
      auVar21._0_8_ = e0.super_dgTemplateVector<double>.m_z;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = e1.super_dgTemplateVector<double>.m_x;
      auVar23._8_8_ = e1.super_dgTemplateVector<double>.m_z;
      auVar23._0_8_ = e1.super_dgTemplateVector<double>.m_z;
      auVar8._8_8_ = e0.super_dgTemplateVector<double>.m_z;
      auVar8._0_8_ = e0.super_dgTemplateVector<double>.m_y;
      auVar7._8_8_ = e1.super_dgTemplateVector<double>.m_z;
      auVar7._0_8_ = e1.super_dgTemplateVector<double>.m_y;
      auVar17 = vunpcklpd_avx(auVar21,auVar19);
      auVar16 = vunpcklpd_avx(auVar23,auVar16);
      auVar22._0_8_ = e1.super_dgTemplateVector<double>.m_y * auVar17._0_8_;
      auVar22._8_8_ = e1.super_dgTemplateVector<double>.m_z * auVar17._8_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = e1.super_dgTemplateVector<double>.m_x * e0.super_dgTemplateVector<double>.m_y;
      auVar17 = vfmsub231sd_fma(auVar17,auVar19,auVar7);
      p.super_dgTemplateVector<double>._0_16_ = vfmsub213pd_fma(auVar16,auVar8,auVar22);
      p.super_dgTemplateVector<double>.m_z = auVar17._0_8_;
      p.super_dgTemplateVector<double>.m_w = e0.super_dgTemplateVector<double>.m_w;
      dgBigVector::dgBigVector
                ((dgBigVector *)&n.super_dgTemplateVector<double>,&p.super_dgTemplateVector<double>)
      ;
      auVar17 = ZEXT816(0) << 0x40;
      iVar15 = 0;
      for (iVar13 = 0; iVar13 != 3; iVar13 = iVar13 + 1) {
        auVar20._0_8_ = auVar17._0_8_;
        pdVar12 = dgTemplateVector<double>::operator[](&n.super_dgTemplateVector<double>,iVar13);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *pdVar12;
        auVar20._8_8_ = 0;
        auVar6._8_8_ = 0x7fffffffffffffff;
        auVar6._0_8_ = 0x7fffffffffffffff;
        auVar16 = vandpd_avx512vl(auVar18,auVar6);
        auVar17 = vmaxsd_avx(auVar16,auVar20);
        if (auVar20._0_8_ < auVar16._0_8_) {
          iVar15 = iVar13;
        }
      }
      lVar5 = (long)(iVar15 + 1) % 3;
      i_00 = (HaI32)((char)((char)lVar5 + '\x01') % '\x03');
      if (iVar15 == 1) {
        iVar13 = i_00;
        i_00 = 2;
      }
      else {
        iVar13 = (int)lVar5;
      }
      pdVar14 = (dgEdge *)((long)pdVar9 + 0x28);
      do {
        pdVar11 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[]
                            (&attribArray,(HaI32)pdVar14->m_userData);
        pdVar4 = this->m_points;
        iVar2 = pdVar14->m_incidentVertex;
        auVar1._0_8_ = pdVar4[iVar2].super_dgTemplateVector<double>.m_x;
        auVar1._8_8_ = pdVar4[iVar2].super_dgTemplateVector<double>.m_y;
        local_f8.m_w = pdVar4[iVar2].super_dgTemplateVector<double>.m_w;
        auVar17 = vsubpd_avx(auVar1,(undefined1  [16])minVal.super_dgTemplateVector<double>._0_16_);
        local_f8.m_x = auVar17._0_8_ * scale.super_dgTemplateVector<double>.m_x;
        local_f8.m_y = auVar17._8_8_ * scale.super_dgTemplateVector<double>.m_y;
        local_f8.m_z = (pdVar4[iVar2].super_dgTemplateVector<double>.m_z -
                       minVal.super_dgTemplateVector<double>.m_z) *
                       scale.super_dgTemplateVector<double>.m_z;
        dgBigVector::dgBigVector((dgBigVector *)&p.super_dgTemplateVector<double>,&local_f8);
        pdVar12 = dgTemplateVector<double>::operator[](&p.super_dgTemplateVector<double>,iVar13);
        pdVar11->m_u0 = (HaF64)*pdVar12;
        pdVar12 = dgTemplateVector<double>::operator[](&p.super_dgTemplateVector<double>,i_00);
        pdVar11->m_v0 = (HaF64)*pdVar12;
        pdVar11->m_u1 = 0.0;
        pdVar11->m_v1 = 0.0;
        pdVar11->m_material = (HaF64)(double)materialArray[iVar15];
        pdVar14 = pdVar14->m_next;
      } while (pdVar14 != (dgEdge *)((long)pdVar9 + 0x28));
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_168,0);
  }
  pdVar11 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[](&attribArray,0);
  ApplyAttributeArray(this,pdVar11);
  free(attribArray.super_dgStackBase.m_ptr);
  return;
}

Assistant:

void dgMeshEffect::BoxMapping (hacd::HaI32 front, hacd::HaI32 side, hacd::HaI32 top)
{
	dgBigVector minVal;
	dgBigVector maxVal;
	hacd::HaI32 materialArray[3];

	GetMinMax (minVal, maxVal, &m_points[0][0], m_pointCount, sizeof (dgBigVector));
	dgBigVector dist (maxVal - minVal);
	dgBigVector scale (hacd::HaF64 (1.0f)/ dist[0], hacd::HaF64 (1.0f)/ dist[1], hacd::HaF64 (1.0f)/ dist[2], hacd::HaF64 (0.0f));

	dgStack<dgVertexAtribute>attribArray (GetCount());
	EnumerateAttributeArray (&attribArray[0]);

	materialArray[0] = front;
	materialArray[1] = side;
	materialArray[2] = top;

	hacd::HaI32 mark = IncLRU();
	dgPolyhedra::Iterator iter (*this);	
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		if (edge->m_mark < mark){
			const dgBigVector& p0 = m_points[edge->m_incidentVertex];
			const dgBigVector& p1 = m_points[edge->m_next->m_incidentVertex];
			const dgBigVector& p2 = m_points[edge->m_prev->m_incidentVertex];

			edge->m_mark = mark;
			edge->m_next->m_mark = mark;
			edge->m_prev->m_mark = mark;

			dgBigVector e0 (p1 - p0);
			dgBigVector e1 (p2 - p0);
			dgBigVector n (e0 * e1);
			
			hacd::HaI32 index = 0;
			hacd::HaF64 maxProjection = hacd::HaF32 (0.0f);

			for (hacd::HaI32 i = 0; i < 3; i ++) {
				hacd::HaF64 proj = fabs (n[i]);
				if (proj > maxProjection) {
					index = i;
					maxProjection = proj;
				}
			}

			hacd::HaI32 u = (index + 1) % 3;
			hacd::HaI32 v = (u + 1) % 3;
			if (index == 1) {
				Swap (u, v);
			}
			dgEdge* ptr = edge;
			do {
				dgVertexAtribute& attrib = attribArray[hacd::HaI32 (ptr->m_userData)];
				dgBigVector p (scale.CompProduct(m_points[ptr->m_incidentVertex] - minVal));
				attrib.m_u0 = p[u];
				attrib.m_v0 = p[v];
				attrib.m_u1 = hacd::HaF64(0.0f);
				attrib.m_v1 = hacd::HaF64(0.0f);
				attrib.m_material = materialArray[index];

				ptr = ptr->m_next;
			}while (ptr !=  edge);
		}
	}

	ApplyAttributeArray (&attribArray[0]);
}